

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O0

Abc_Obj_t * Abc_NtkCreateObj(Abc_Ntk_t *pNtk,Abc_ObjType_t Type)

{
  Abc_Obj_t *Entry;
  Abc_Obj_t *pObj;
  Abc_ObjType_t Type_local;
  Abc_Ntk_t *pNtk_local;
  
  Entry = Abc_ObjAlloc(pNtk,Type);
  Entry->Id = pNtk->vObjs->nSize;
  Vec_PtrPush(pNtk->vObjs,Entry);
  pNtk->nObjCounts[Type] = pNtk->nObjCounts[Type] + 1;
  pNtk->nObjs = pNtk->nObjs + 1;
  switch(Type) {
  case ABC_OBJ_NONE:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                  ,0x7a,"Abc_Obj_t *Abc_NtkCreateObj(Abc_Ntk_t *, Abc_ObjType_t)");
  case ABC_OBJ_CONST1:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                  ,0x7d,"Abc_Obj_t *Abc_NtkCreateObj(Abc_Ntk_t *, Abc_ObjType_t)");
  case ABC_OBJ_PI:
    Vec_PtrPush(pNtk->vPis,Entry);
    Vec_PtrPush(pNtk->vCis,Entry);
    break;
  case ABC_OBJ_PO:
    Vec_PtrPush(pNtk->vPos,Entry);
    Vec_PtrPush(pNtk->vCos,Entry);
    break;
  case ABC_OBJ_BI:
    if (pNtk->vCos != (Vec_Ptr_t *)0x0) {
      Vec_PtrPush(pNtk->vCos,Entry);
    }
    break;
  case ABC_OBJ_BO:
    if (pNtk->vCis != (Vec_Ptr_t *)0x0) {
      Vec_PtrPush(pNtk->vCis,Entry);
    }
    break;
  case ABC_OBJ_NET:
  case ABC_OBJ_NODE:
    break;
  case ABC_OBJ_LATCH:
    (Entry->field_5).pData = (void *)0x0;
  case ABC_OBJ_WHITEBOX:
  case ABC_OBJ_BLACKBOX:
    if (pNtk->vBoxes != (Vec_Ptr_t *)0x0) {
      Vec_PtrPush(pNtk->vBoxes,Entry);
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                  ,0x99,"Abc_Obj_t *Abc_NtkCreateObj(Abc_Ntk_t *, Abc_ObjType_t)");
  }
  return Entry;
}

Assistant:

Abc_Obj_t * Abc_NtkCreateObj( Abc_Ntk_t * pNtk, Abc_ObjType_t Type )
{
    Abc_Obj_t * pObj;
    // create new object, assign ID, and add to the array
    pObj = Abc_ObjAlloc( pNtk, Type );
    pObj->Id = pNtk->vObjs->nSize;
    Vec_PtrPush( pNtk->vObjs, pObj );
    pNtk->nObjCounts[Type]++;
    pNtk->nObjs++;
    // perform specialized operations depending on the object type
    switch (Type)
    {
        case ABC_OBJ_NONE:   
            assert(0); 
            break;
        case ABC_OBJ_CONST1: 
            assert(0); 
            break;
        case ABC_OBJ_PI:
//            pObj->iTemp = Vec_PtrSize(pNtk->vCis);
            Vec_PtrPush( pNtk->vPis, pObj );
            Vec_PtrPush( pNtk->vCis, pObj );
            break;
        case ABC_OBJ_PO:     
//            pObj->iTemp = Vec_PtrSize(pNtk->vCos);
            Vec_PtrPush( pNtk->vPos, pObj );
            Vec_PtrPush( pNtk->vCos, pObj );
            break;
        case ABC_OBJ_BI:     
            if ( pNtk->vCos ) Vec_PtrPush( pNtk->vCos, pObj );
            break;
        case ABC_OBJ_BO:     
            if ( pNtk->vCis ) Vec_PtrPush( pNtk->vCis, pObj );
            break;
        case ABC_OBJ_NET:  
        case ABC_OBJ_NODE: 
            break;
        case ABC_OBJ_LATCH:     
            pObj->pData = (void *)ABC_INIT_NONE;
        case ABC_OBJ_WHITEBOX:     
        case ABC_OBJ_BLACKBOX:     
            if ( pNtk->vBoxes ) Vec_PtrPush( pNtk->vBoxes, pObj );
            break;
        default:
            assert(0); 
            break;
    }
    return pObj;
}